

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeString::indexOf
          (UnicodeString *this,UChar *srcChars,int32_t srcStart,int32_t srcLength,int32_t start,
          int32_t length)

{
  uint uVar1;
  UChar *pUVar2;
  char16_t *pcVar3;
  int32_t length_local;
  int32_t start_local;
  
  uVar1 = 0xffffffff;
  if ((((srcLength != 0) && (-1 < srcStart)) && (srcChars != (UChar *)0x0)) &&
     ((((this->fUnion).fStackFields.fLengthAndFlags & 1U) == 0 &&
      ((-1 < srcLength || (srcChars[(uint)srcStart] != L'\0')))))) {
    length_local = length;
    start_local = start;
    pinIndices(this,&start_local,&length_local);
    if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      pcVar3 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&this->fUnion + 2);
    }
    pUVar2 = u_strFindFirst_63(pcVar3 + start_local,length_local,srcChars + (uint)srcStart,srcLength
                              );
    uVar1 = -(uint)(pUVar2 == (UChar *)0x0) | (uint)((ulong)((long)pUVar2 - (long)pcVar3) >> 1);
  }
  return uVar1;
}

Assistant:

int32_t 
UnicodeString::indexOf(const UChar *srcChars,
               int32_t srcStart,
               int32_t srcLength,
               int32_t start,
               int32_t length) const
{
  if(isBogus() || srcChars == 0 || srcStart < 0 || srcLength == 0) {
    return -1;
  }

  // UnicodeString does not find empty substrings
  if(srcLength < 0 && srcChars[srcStart] == 0) {
    return -1;
  }

  // get the indices within bounds
  pinIndices(start, length);

  // find the first occurrence of the substring
  const UChar *array = getArrayStart();
  const UChar *match = u_strFindFirst(array + start, length, srcChars + srcStart, srcLength);
  if(match == NULL) {
    return -1;
  } else {
    return (int32_t)(match - array);
  }
}